

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

void quantize_row_q8_K_ref(float *x,block_q8_K *y,int64_t k)

{
  float *pfVar1;
  ulong uVar2;
  char cVar3;
  short sVar7;
  short sVar8;
  short sVar9;
  int j;
  long lVar10;
  long lVar11;
  int8_t *piVar12;
  int16_t *piVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  float fVar26;
  float fVar36;
  float fVar37;
  undefined1 auVar27 [16];
  undefined1 auVar35 [16];
  short sVar38;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  char cVar4;
  char cVar5;
  char cVar6;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 uVar25;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined4 uVar39;
  undefined6 uVar40;
  
  lVar14 = k + 0xff;
  if (-1 < k) {
    lVar14 = k;
  }
  if (0xff < k) {
    piVar12 = y->qs;
    piVar13 = y->bsums;
    lVar11 = 0;
    auVar42 = _DAT_0014e800;
    auVar43 = _DAT_0014e720;
    do {
      lVar10 = 0;
      fVar16 = 0.0;
      fVar26 = 0.0;
      do {
        fVar15 = ABS(x[lVar10]);
        fVar16 = (float)(~-(uint)(fVar26 < fVar15) & (uint)fVar16 |
                        (uint)x[lVar10] & -(uint)(fVar26 < fVar15));
        if (fVar15 <= fVar26) {
          fVar15 = fVar26;
        }
        lVar10 = lVar10 + 1;
        fVar26 = fVar15;
      } while (lVar10 != 0x100);
      if ((fVar15 != 0.0) || (NAN(fVar15))) {
        fVar16 = -127.0 / fVar16;
        lVar10 = 0;
        do {
          pfVar1 = x + lVar10;
          fVar26 = *pfVar1 * fVar16 + 12582912.0;
          fVar15 = pfVar1[1] * fVar16 + 12582912.0;
          fVar36 = pfVar1[2] * fVar16 + 12582912.0;
          fVar37 = pfVar1[3] * fVar16 + 12582912.0;
          auVar35._0_4_ = -(uint)((int)((uint)fVar26 & 0x7fffff) < auVar42._0_4_);
          auVar35._4_4_ = -(uint)((int)((uint)fVar15 & 0x7fffff) < auVar42._4_4_);
          auVar35._8_4_ = -(uint)((int)((uint)fVar36 & 0x7fffff) < auVar42._8_4_);
          auVar35._12_4_ = -(uint)((int)((uint)fVar37 & 0x7fffff) < auVar42._12_4_);
          auVar41._0_4_ = (uint)fVar26 & auVar35._0_4_;
          auVar41._4_4_ = (uint)fVar15 & auVar35._4_4_;
          auVar41._8_4_ = (uint)fVar36 & auVar35._8_4_;
          auVar41._12_4_ = (uint)fVar37 & auVar35._12_4_;
          auVar41 = (~auVar35 & auVar42 | auVar41) & auVar43;
          sVar7 = auVar41._0_2_;
          cVar3 = (0 < sVar7) * (sVar7 < 0x100) * auVar41[0] - (0xff < sVar7);
          sVar7 = auVar41._2_2_;
          sVar38 = CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar41[2] - (0xff < sVar7),cVar3);
          sVar7 = auVar41._4_2_;
          cVar4 = (0 < sVar7) * (sVar7 < 0x100) * auVar41[4] - (0xff < sVar7);
          sVar7 = auVar41._6_2_;
          uVar39 = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar41[6] - (0xff < sVar7),
                            CONCAT12(cVar4,sVar38));
          sVar7 = auVar41._8_2_;
          cVar5 = (0 < sVar7) * (sVar7 < 0x100) * auVar41[8] - (0xff < sVar7);
          sVar7 = auVar41._10_2_;
          uVar40 = CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar41[10] - (0xff < sVar7),
                            CONCAT14(cVar5,uVar39));
          sVar7 = auVar41._12_2_;
          cVar6 = (0 < sVar7) * (sVar7 < 0x100) * auVar41[0xc] - (0xff < sVar7);
          sVar9 = auVar41._14_2_;
          sVar7 = (short)((uint)uVar39 >> 0x10);
          sVar8 = (short)((uint6)uVar40 >> 0x20);
          sVar9 = (short)(CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar41[0xe] - (0xff < sVar9),
                                   CONCAT16(cVar6,uVar40)) >> 0x30);
          *(uint *)(piVar12 + lVar10) =
               CONCAT13((0 < sVar9) * (sVar9 < 0x100) * cVar6 - (0xff < sVar9),
                        CONCAT12((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                                 CONCAT11((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                                          (0 < sVar38) * (sVar38 < 0x100) * cVar3 - (0xff < sVar38))
                                ));
          lVar10 = lVar10 + 4;
        } while (lVar10 != 0x100);
        lVar10 = 0;
        do {
          uVar2 = *(ulong *)(piVar12 + lVar10 * 8);
          uVar25 = (undefined1)(uVar2 >> 0x38);
          auVar24._8_6_ = 0;
          auVar24._0_8_ = uVar2;
          auVar24[0xe] = uVar25;
          auVar24[0xf] = uVar25;
          uVar25 = (undefined1)(uVar2 >> 0x30);
          auVar23._14_2_ = auVar24._14_2_;
          auVar23._8_5_ = 0;
          auVar23._0_8_ = uVar2;
          auVar23[0xd] = uVar25;
          auVar22._13_3_ = auVar23._13_3_;
          auVar22._8_4_ = 0;
          auVar22._0_8_ = uVar2;
          auVar22[0xc] = uVar25;
          uVar25 = (undefined1)(uVar2 >> 0x28);
          auVar21._12_4_ = auVar22._12_4_;
          auVar21._8_3_ = 0;
          auVar21._0_8_ = uVar2;
          auVar21[0xb] = uVar25;
          auVar20._11_5_ = auVar21._11_5_;
          auVar20._8_2_ = 0;
          auVar20._0_8_ = uVar2;
          auVar20[10] = uVar25;
          uVar25 = (undefined1)(uVar2 >> 0x20);
          auVar19._10_6_ = auVar20._10_6_;
          auVar19[8] = 0;
          auVar19._0_8_ = uVar2;
          auVar19[9] = uVar25;
          auVar18._9_7_ = auVar19._9_7_;
          auVar18[8] = uVar25;
          auVar18._0_8_ = uVar2;
          uVar25 = (undefined1)(uVar2 >> 0x18);
          auVar17._8_8_ = auVar18._8_8_;
          auVar17[7] = uVar25;
          auVar17[6] = uVar25;
          uVar25 = (undefined1)(uVar2 >> 0x10);
          auVar17[5] = uVar25;
          auVar17[4] = uVar25;
          uVar25 = (undefined1)(uVar2 >> 8);
          auVar17[3] = uVar25;
          auVar17[2] = uVar25;
          auVar17[0] = (undefined1)uVar2;
          auVar17[1] = auVar17[0];
          auVar41 = psraw(auVar17,8);
          uVar2 = *(ulong *)(piVar12 + lVar10 * 8 + 8);
          uVar25 = (undefined1)(uVar2 >> 0x38);
          auVar34._8_6_ = 0;
          auVar34._0_8_ = uVar2;
          auVar34[0xe] = uVar25;
          auVar34[0xf] = uVar25;
          uVar25 = (undefined1)(uVar2 >> 0x30);
          auVar33._14_2_ = auVar34._14_2_;
          auVar33._8_5_ = 0;
          auVar33._0_8_ = uVar2;
          auVar33[0xd] = uVar25;
          auVar32._13_3_ = auVar33._13_3_;
          auVar32._8_4_ = 0;
          auVar32._0_8_ = uVar2;
          auVar32[0xc] = uVar25;
          uVar25 = (undefined1)(uVar2 >> 0x28);
          auVar31._12_4_ = auVar32._12_4_;
          auVar31._8_3_ = 0;
          auVar31._0_8_ = uVar2;
          auVar31[0xb] = uVar25;
          auVar30._11_5_ = auVar31._11_5_;
          auVar30._8_2_ = 0;
          auVar30._0_8_ = uVar2;
          auVar30[10] = uVar25;
          uVar25 = (undefined1)(uVar2 >> 0x20);
          auVar29._10_6_ = auVar30._10_6_;
          auVar29[8] = 0;
          auVar29._0_8_ = uVar2;
          auVar29[9] = uVar25;
          auVar28._9_7_ = auVar29._9_7_;
          auVar28[8] = uVar25;
          auVar28._0_8_ = uVar2;
          uVar25 = (undefined1)(uVar2 >> 0x18);
          auVar27._8_8_ = auVar28._8_8_;
          auVar27[7] = uVar25;
          auVar27[6] = uVar25;
          uVar25 = (undefined1)(uVar2 >> 0x10);
          auVar27[5] = uVar25;
          auVar27[4] = uVar25;
          uVar25 = (undefined1)(uVar2 >> 8);
          auVar27[3] = uVar25;
          auVar27[2] = uVar25;
          auVar27[0] = (undefined1)uVar2;
          auVar27[1] = auVar27[0];
          auVar35 = psraw(auVar27,8);
          *(short *)((long)piVar13 + lVar10) =
               auVar35._14_2_ + auVar41._14_2_ + auVar35._6_2_ + auVar41._6_2_ +
               auVar35._10_2_ + auVar41._10_2_ + auVar35._2_2_ + auVar41._2_2_ +
               auVar35._12_2_ + auVar41._12_2_ + auVar35._4_2_ + auVar41._4_2_ +
               auVar35._8_2_ + auVar41._8_2_ + auVar35._0_2_ + auVar41._0_2_;
          lVar10 = lVar10 + 2;
        } while (lVar10 != 0x20);
        y[lVar11].d = 1.0 / fVar16;
      }
      else {
        memset(y + lVar11,0,0x104);
        auVar42 = _DAT_0014e800;
        auVar43 = _DAT_0014e720;
      }
      x = x + 0x100;
      lVar11 = lVar11 + 1;
      piVar12 = piVar12 + 0x124;
      piVar13 = piVar13 + 0x92;
    } while (lVar11 != lVar14 >> 8);
  }
  return;
}

Assistant:

void quantize_row_q8_K_ref(const float * GGML_RESTRICT x, block_q8_K * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    for (int i = 0; i < nb; i++) {

        float max = 0;
        float amax = 0;
        for (int j = 0; j < QK_K; ++j) {
            float ax = fabsf(x[j]);
            if (ax > amax) {
                amax = ax; max = x[j];
            }
        }
        if (!amax) {
            y[i].d = 0;
            memset(y[i].qs, 0, QK_K);
            x += QK_K;
            continue;
        }
        //const float iscale = -128.f/max;
        // We need this change for IQ2_XXS, else the AVX implementation becomes very awkward
        const float iscale = -127.f/max;
        for (int j = 0; j < QK_K; ++j) {
            int v = nearest_int(iscale*x[j]);
            y[i].qs[j] = MIN(127, v);
        }
        for (int j = 0; j < QK_K/16; ++j) {
            int sum = 0;
            for (int ii = 0; ii < 16; ++ii) {
                sum += y[i].qs[j*16 + ii];
            }
            y[i].bsums[j] = sum;
        }
        y[i].d = 1/iscale;
        x += QK_K;
    }
}